

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

bool __thiscall
cmFindLibraryHelper::CheckDirectoryForName(cmFindLibraryHelper *this,string *path,Name *name)

{
  string *name_00;
  pointer pcVar1;
  char *pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  size_type sVar5;
  cmFindLibraryHelper *this_00;
  bool bVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  _Rb_tree_header *p_Var8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  _Base_ptr p_Var11;
  ulong uVar12;
  string *psVar13;
  ulong uVar14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string testPath;
  uint minor;
  string dir;
  uint major;
  string local_f8;
  pointer local_d8;
  undefined8 local_d0;
  uint local_c4;
  Name *local_c0;
  cmFindLibraryHelper *local_b8;
  uint local_b0;
  uint local_ac;
  ulong local_a8;
  ulong local_a0;
  string *local_98;
  string local_90;
  string *local_70;
  string *local_68;
  string *local_60;
  RegularExpression *local_58;
  string local_50;
  
  local_b8 = this;
  local_98 = path;
  if (name->TryRaw == true) {
    local_f8._M_string_length = (size_type)(path->_M_dataplus)._M_p;
    local_f8._M_dataplus._M_p = (pointer)path->_M_string_length;
    local_f8.field_2._M_allocated_capacity = 0;
    local_d8 = (name->Raw)._M_dataplus._M_p;
    local_f8.field_2._8_8_ = (name->Raw)._M_string_length;
    local_d0 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_f8;
    cmCatViews(&local_90,views);
    psVar13 = &this->TestPath;
    std::__cxx11::string::operator=((string *)psVar13,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    name_00 = &name->Raw;
    bVar6 = cmsys::SystemTools::FileExists(psVar13,true);
    this = local_b8;
    if (bVar6) {
      cmsys::SystemTools::CollapseFullPath(&local_f8,psVar13);
      this_00 = local_b8;
      bVar6 = cmFindBase::Validate(local_b8->FindBase,&local_f8);
      if (bVar6) {
        DebugLibraryFound(this_00,name_00,local_98);
        std::__cxx11::string::_M_assign((string *)&this_00->BestPath);
      }
      else {
        DebugLibraryFailed(this_00,name_00,local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      this = local_b8;
      path = local_98;
      if (bVar6) {
        return true;
      }
    }
    else {
      DebugLibraryFailed(local_b8,name_00,path);
    }
  }
  local_a0 = (long)(this->Prefixes).Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Prefixes).Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (long)(this->Suffixes).Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Suffixes).Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + path->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_90);
  local_c0 = name;
  psVar7 = cmGlobalGenerator::GetDirectoryContent(this->GG,&local_90,true);
  p_Var11 = (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(psVar7->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var8) {
    local_a0 = (long)local_a0 >> 5;
    local_a8 = (long)local_a8 >> 5;
    local_58 = &local_c0->Regex;
    psVar13 = &this->TestPath;
    local_60 = &local_c0->Raw;
    local_68 = (string *)&this->BestPath;
    local_b0 = 0;
    local_ac = 0;
    local_70 = psVar13;
    do {
      bVar6 = cmsys::RegularExpression::find(local_58,*(char **)(p_Var11 + 1),&local_58->regmatch);
      if (bVar6) {
        local_f8._M_string_length = (size_type)(local_98->_M_dataplus)._M_p;
        local_f8._M_dataplus._M_p = (pointer)local_98->_M_string_length;
        local_f8.field_2._M_allocated_capacity = 0;
        local_d8 = *(pointer *)(p_Var11 + 1);
        local_f8.field_2._8_8_ = p_Var11[1]._M_parent;
        local_d0 = 0;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_f8;
        cmCatViews(&local_50,views_00);
        std::__cxx11::string::operator=((string *)psVar13,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)local_50._M_dataplus._M_p) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)local_50._M_dataplus._M_p),
                          local_50.field_2._M_allocated_capacity + 1);
        }
        bVar6 = cmsys::SystemTools::FileExists(psVar13,true);
        if (bVar6) {
          cmsys::SystemTools::CollapseFullPath(&local_f8,psVar13);
          bVar6 = cmFindBase::Validate(this->FindBase,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if (bVar6) {
            DebugLibraryFound(this,local_60,&local_90);
            pcVar2 = (local_c0->Regex).regmatch.startp[1];
            if (pcVar2 == (char *)0x0) {
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              local_f8._M_string_length = 0;
              local_f8.field_2._M_allocated_capacity =
                   local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f8,pcVar2,(local_c0->Regex).regmatch.endp[1]);
            }
            _Var9 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((this->Prefixes).Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (this->Prefixes).Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,&local_f8);
            pbVar3 = (this->Prefixes).Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            pcVar2 = (local_c0->Regex).regmatch.startp[2];
            if (pcVar2 == (char *)0x0) {
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              local_f8._M_string_length = 0;
              local_f8.field_2._M_allocated_capacity =
                   local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f8,pcVar2,(local_c0->Regex).regmatch.endp[2]);
            }
            _Var10 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               ((this->Suffixes).Values.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (this->Suffixes).Values.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_f8);
            pbVar4 = (this->Suffixes).Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            local_50._M_dataplus._M_p._0_4_ = 0;
            local_c4 = 0;
            if (local_b8->IsOpenBSD == true) {
              pcVar2 = (local_c0->Regex).regmatch.startp[3];
              if (pcVar2 == (char *)0x0) {
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                local_f8._M_string_length = 0;
                local_f8.field_2._M_allocated_capacity =
                     local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              }
              else {
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f8,pcVar2,(local_c0->Regex).regmatch.endp[3]);
              }
              __isoc99_sscanf(local_f8._M_dataplus._M_p,".%u.%u",&local_50,&local_c4);
              psVar13 = local_70;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
                psVar13 = local_70;
              }
            }
            uVar14 = (long)_Var9._M_current - (long)pbVar3 >> 5;
            uVar12 = (long)_Var10._M_current - (long)pbVar4 >> 5;
            if (((((local_b8->BestPath)._M_string_length == 0) || (uVar14 < local_a0)) ||
                ((uVar14 == local_a0 && (uVar12 < local_a8)))) ||
               (((this = local_b8, uVar14 == local_a0 && (uVar12 == local_a8)) &&
                ((local_ac < (uint)local_50._M_dataplus._M_p ||
                 (((uint)local_50._M_dataplus._M_p == local_ac && (local_b0 < local_c4)))))))) {
              std::__cxx11::string::_M_assign(local_68);
              local_ac = (uint)local_50._M_dataplus._M_p;
              local_b0 = local_c4;
              this = local_b8;
              local_a8 = uVar12;
              local_a0 = uVar14;
            }
          }
        }
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var8);
  }
  if ((this->BestPath)._M_string_length == 0) {
    DebugLibraryFailed(this,&local_c0->Raw,&local_90);
  }
  else {
    DebugLibraryFound(this,&local_c0->Raw,&this->BestPath);
  }
  sVar5 = (this->BestPath)._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return sVar5 != 0;
}

Assistant:

bool cmFindLibraryHelper::CheckDirectoryForName(std::string const& path,
                                                Name& name)
{
  // If the original library name provided by the user matches one of
  // the suffixes, try it first.  This allows users to search
  // specifically for a static library on some platforms (on MS tools
  // one cannot tell just from the library name whether it is a static
  // library or an import library).
  if (name.TryRaw) {
    this->TestPath = cmStrCat(path, name.Raw);

    const bool exists = cmSystemTools::FileExists(this->TestPath, true);
    if (!exists) {
      this->DebugLibraryFailed(name.Raw, path);
    } else {
      auto testPath = cmSystemTools::CollapseFullPath(this->TestPath);
      if (this->Validate(testPath)) {
        this->DebugLibraryFound(name.Raw, path);
        this->BestPath = testPath;
        return true;
      }
      this->DebugLibraryFailed(name.Raw, path);
    }
  }

  // No library file has yet been found.
  size_type bestPrefix = this->Prefixes.size();
  size_type bestSuffix = this->Suffixes.size();
  unsigned int bestMajor = 0;
  unsigned int bestMinor = 0;

  // Search for a file matching the library name regex.
  std::string dir = path;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::set<std::string> const& files = this->GG->GetDirectoryContent(dir);
  for (std::string const& origName : files) {
#if defined(_WIN32) || defined(__APPLE__)
    std::string testName = cmSystemTools::LowerCase(origName);
#else
    std::string const& testName = origName;
#endif
    if (name.Regex.find(testName)) {
      this->TestPath = cmStrCat(path, origName);
      // Make sure the path is readable and is not a directory.
      if (cmSystemTools::FileExists(this->TestPath, true)) {
        if (!this->Validate(cmSystemTools::CollapseFullPath(this->TestPath))) {
          continue;
        }

        this->DebugLibraryFound(name.Raw, dir);
        // This is a matching file.  Check if it is better than the
        // best name found so far.  Earlier prefixes are preferred,
        // followed by earlier suffixes.  For OpenBSD, shared library
        // version extensions are compared.
        size_type prefix = this->GetPrefixIndex(name.Regex.match(1));
        size_type suffix = this->GetSuffixIndex(name.Regex.match(2));
        unsigned int major = 0;
        unsigned int minor = 0;
        if (this->IsOpenBSD) {
          sscanf(name.Regex.match(3).c_str(), ".%u.%u", &major, &minor);
        }
        if (this->BestPath.empty() || prefix < bestPrefix ||
            (prefix == bestPrefix && suffix < bestSuffix) ||
            (prefix == bestPrefix && suffix == bestSuffix &&
             (major > bestMajor ||
              (major == bestMajor && minor > bestMinor)))) {
          this->BestPath = this->TestPath;
          bestPrefix = prefix;
          bestSuffix = suffix;
          bestMajor = major;
          bestMinor = minor;
        }
      }
    }
  }

  if (this->BestPath.empty()) {
    this->DebugLibraryFailed(name.Raw, dir);
  } else {
    this->DebugLibraryFound(name.Raw, this->BestPath);
  }

  // Use the best candidate found in this directory, if any.
  return !this->BestPath.empty();
}